

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckLink(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  ctmbstr ptVar4;
  AttVal *local_28;
  AttVal *av;
  Bool HasType;
  Bool HasRel;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  bVar2 = false;
  BVar3 = Level1_Enabled(doc);
  if (BVar3 != no) {
    for (local_28 = node->attributes; local_28 != (AttVal *)0x0; local_28 = local_28->next) {
      if (((((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
           (local_28->dict->id == TidyAttr_REL)) &&
          ((BVar3 = hasValue(local_28), BVar3 != no && (local_28 != (AttVal *)0x0)))) &&
         ((local_28->value != (tmbstr)0x0 &&
          (ptVar4 = prvTidytmbsubstr(local_28->value,"stylesheet"), ptVar4 != (ctmbstr)0x0)))) {
        bVar1 = true;
      }
      if (((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
         ((local_28->dict->id == TidyAttr_TYPE && (BVar3 = hasValue(local_28), BVar3 != no)))) {
        bVar2 = true;
      }
    }
    if ((bVar1) && (bVar2)) {
      prvTidyReportAccessError(doc,node,0x2d0);
    }
  }
  return;
}

Assistant:

static void CheckLink( TidyDocImpl* doc, Node* node )
{
    Bool HasRel = no;
    Bool HasType = no;

    if (Level1_Enabled( doc ))
    {
        AttVal* av;
        /* Check for valid 'REL' and 'TYPE' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsREL(av) && hasValue(av) )
            {
                if (AttrContains(av, "stylesheet"))
                    HasRel = yes;
            }

            if ( attrIsTYPE(av) && hasValue(av) )
            {
                HasType = yes;
            }
        }

        if (HasRel && HasType)
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_LINK );
    }
}